

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O1

FaceHandle __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::add_face
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VHandles *_indices)

{
  _Rb_tree_header *p_Var1;
  BaseHandle BVar2;
  int iVar3;
  pointer pVVar4;
  mesh_ptr pPVar5;
  _Base_ptr p_Var6;
  double dVar7;
  HalfedgeHandle _idx;
  bool bVar8;
  BaseHandle _fh;
  pointer pVVar9;
  mostream *pmVar10;
  Face *pFVar11;
  Halfedge *pHVar12;
  PropertyT<OpenMesh::VectorT<double,_3>_> *this_00;
  reference pvVar13;
  _Base_ptr p_Var14;
  pointer pVVar15;
  pointer pVVar16;
  _Rb_tree_header *p_Var17;
  undefined1 local_48 [8];
  FaceHalfedgeIter fh_iter;
  
  pVVar16 = (_indices->
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (_indices->
           super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  _fh.idx_ = -1;
  if (8 < (ulong)((long)pVVar4 - (long)pVVar16)) {
    for (; pVVar16 != pVVar4; pVVar16 = pVVar16 + 1) {
      bVar8 = ArrayKernel::is_valid_handle
                        ((ArrayKernel *)this->mesh_,(VertexHandle)(pVVar16->super_BaseHandle).idx_);
      if (!bVar8) {
        pmVar10 = omerr();
        std::__ostream_insert<char,std::char_traits<char>>
                  (&pmVar10->super_ostream,"ImporterT: Face contains invalid vertex index\n",0x2e);
        return (FaceHandle)-1;
      }
    }
    pVVar16 = (_indices->
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>).
              _M_impl.super__Vector_impl_data._M_start;
    while (pVVar9 = pVVar16, pVVar9 != pVVar4) {
      pVVar16 = pVVar9 + 1;
      if (pVVar16 != pVVar4) {
        pVVar15 = pVVar16;
        do {
          if ((pVVar9->super_BaseHandle).idx_ == (pVVar15->super_BaseHandle).idx_) {
            pmVar10 = omerr();
            std::__ostream_insert<char,std::char_traits<char>>
                      (&pmVar10->super_ostream,"ImporterT: Face has equal vertices\n",0x23);
            goto LAB_0016e9f8;
          }
          pVVar15 = pVVar15 + 1;
        } while (pVVar15 != pVVar4);
      }
    }
    _fh.idx_ = (int)TriConnectivity::add_face((TriConnectivity *)this->mesh_,_indices);
    if (_fh.idx_ == -1) {
LAB_0016e9f8:
      std::
      vector<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>,_std::allocator<std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>_>_>
      ::push_back(&this->failed_faces_,_indices);
    }
    else {
      pPVar5 = (mesh_ptr)this->mesh_;
      if (*(int *)((long)&pPVar5[1].super_ArrayKernel.super_BaseKernel.vprops_.properties_.
                          super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                          ._M_impl.super__Vector_impl_data + 0x10) != -1) {
        pFVar11 = ArrayKernel::face((ArrayKernel *)pPVar5,(FaceHandle)_fh.idx_);
        fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
             (pFVar11->halfedge_handle_).super_BaseHandle.idx_;
        fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = (BaseHandle)0x0;
        fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = (BaseHandle)0xffffffff;
        p_Var1 = &(this->halfedgeNormals_)._M_t._M_impl.super__Rb_tree_header;
        local_48 = (undefined1  [8])pPVar5;
        fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
             (int)fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        while ((((pPVar5 = (mesh_ptr)this->mesh_,
                 pFVar11 = ArrayKernel::face((ArrayKernel *)pPVar5,(FaceHandle)_fh.idx_),
                 _idx.super_BaseHandle.idx_ =
                      (BaseHandle)
                      (BaseHandle)
                      fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_,
                 local_48 != (undefined1  [8])pPVar5 ||
                 (BVar2.idx_ = (pFVar11->halfedge_handle_).super_BaseHandle.idx_,
                 (int)fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ !=
                 BVar2.idx_)) ||
                (fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ !=
                 BVar2.idx_)) ||
               (fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                super_BaseHandle.idx_ != 1))) {
          if (fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
            __assert_fail("this->heh_.is_valid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/Mesh/CirculatorsT.hh"
                          ,0x115,
                          "value_type OpenMesh::Iterators::GenericCirculatorT<OpenMesh::PolyConnectivity, OpenMesh::FaceHandle, OpenMesh::HalfedgeHandle, &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>::operator*() const [Mesh = OpenMesh::PolyConnectivity, CenterEntityHandle = OpenMesh::FaceHandle, ValueHandle = OpenMesh::HalfedgeHandle, Handle2Value = &OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle]"
                         );
          }
          pHVar12 = ArrayKernel::halfedge
                              ((ArrayKernel *)this->mesh_,
                               (HalfedgeHandle)
                               fh_iter.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                               mesh_._4_4_);
          iVar3 = (pHVar12->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
          p_Var6 = (this->halfedgeNormals_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var14 = &p_Var1->_M_header;
          for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
              p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar3]) {
            if (iVar3 <= (int)*(size_t *)(p_Var6 + 1)) {
              p_Var14 = p_Var6;
            }
          }
          p_Var17 = p_Var1;
          if (((_Rb_tree_header *)p_Var14 != p_Var1) &&
             (p_Var17 = (_Rb_tree_header *)p_Var14,
             iVar3 < (int)((_Rb_tree_header *)p_Var14)->_M_node_count)) {
            p_Var17 = p_Var1;
          }
          if (p_Var17 != p_Var1) {
            this_00 = PropertyContainer::property<OpenMesh::VectorT<double,3>>
                                ((PropertyContainer *)
                                 &(this->mesh_->super_Mesh).
                                  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                  .
                                  super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                  .field_0x28,
                                 (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                                 (this->mesh_->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 .halfedge_normals_.
                                 super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                                 super_BaseHandle.idx_);
            pvVar13 = PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                                (this_00,(int)_idx.super_BaseHandle.idx_);
            dVar7 = *(double *)((long)(p_Var17 + 1) + 8);
            (pvVar13->super_VectorDataT<double,_3>).values_[0] = *(double *)(p_Var17 + 1);
            (pvVar13->super_VectorDataT<double,_3>).values_[1] = dVar7;
            (pvVar13->super_VectorDataT<double,_3>).values_[2] =
                 *(double *)((long)(p_Var17 + 1) + 0x10);
          }
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                        *)local_48);
        }
        std::
        _Rb_tree<OpenMesh::VertexHandle,_std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>,_std::_Select1st<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>,_std::less<OpenMesh::VertexHandle>,_std::allocator<std::pair<const_OpenMesh::VertexHandle,_OpenMesh::VectorT<double,_3>_>_>_>
        ::clear(&(this->halfedgeNormals_)._M_t);
      }
    }
  }
  return (BaseHandle)(BaseHandle)_fh.idx_;
}

Assistant:

virtual FaceHandle add_face(const VHandles& _indices)
  {
    FaceHandle fh;

    if (_indices.size() > 2)
    {
      VHandles::const_iterator it, it2, end(_indices.end());


      // test for valid vertex indices
      for (it=_indices.begin(); it!=end; ++it)
        if (! mesh_.is_valid_handle(*it))
        {
          omerr() << "ImporterT: Face contains invalid vertex index\n";
          return fh;
        }


      // don't allow double vertices
      for (it=_indices.begin(); it!=end; ++it)
        for (it2=it+1; it2!=end; ++it2)
          if (*it == *it2)
          {
            omerr() << "ImporterT: Face has equal vertices\n";
            failed_faces_.push_back(_indices);
            return fh;
          }


      // try to add face
      fh = mesh_.add_face(_indices);
      if (!fh.is_valid())
      {
        failed_faces_.push_back(_indices);
        return fh;
      }

      //write the half edge normals
      if (mesh_.has_halfedge_normals())
      {
        //iterate over all incoming haldedges of the added face
        for (typename Mesh::FaceHalfedgeIter fh_iter = mesh_.fh_begin(fh);
            fh_iter != mesh_.fh_end(fh); ++fh_iter)
        {
          //and write the normals to it
          typename Mesh::HalfedgeHandle heh = *fh_iter;
          typename Mesh::VertexHandle vh = mesh_.to_vertex_handle(heh);
          typename std::map<VertexHandle,Normal>::iterator it_heNs = halfedgeNormals_.find(vh);
          if (it_heNs != halfedgeNormals_.end())
            mesh_.set_normal(heh,it_heNs->second);
        }
        halfedgeNormals_.clear();
      }
    }
    return fh;
  }